

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

char * lyd_path_set(ly_set *dnodes,LYD_PATH_TYPE pathtype)

{
  lyd_node *node;
  size_t sVar1;
  ly_set *plVar2;
  int iVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lysc_node *plVar6;
  lys_module *plVar7;
  size_t sVar8;
  lysc_node **pplVar9;
  char *pcVar10;
  lys_module *plVar11;
  char *pcVar12;
  lyd_node *node_00;
  long lVar13;
  ulong size;
  uint uVar14;
  bool bVar15;
  char *buffer;
  size_t buflen;
  size_t bufused;
  char *local_58;
  size_t local_50;
  size_t local_48;
  LYD_PATH_TYPE local_3c;
  ly_set *local_38;
  
  local_48 = 0;
  local_50 = 0;
  local_58 = (char *)0x0;
  pcVar12 = (char *)0x0;
  if (pathtype < 2) {
    if (dnodes->count == 0) {
      pcVar12 = (char *)0x0;
    }
    else {
      uVar14 = 1;
      local_3c = pathtype;
      local_38 = dnodes;
      do {
        plVar2 = local_38;
        node = (local_38->field_2).dnodes[uVar14 - 1];
        plVar5 = lyd_node_module(node);
        if ((uVar14 < 2) ||
           (node_00 = (plVar2->field_2).dnodes[uVar14 - 2], node_00 == (lyd_node *)0x0)) {
          node_00 = (lyd_node *)0x0;
        }
        else if ((((node->schema != (lysc_node *)0x0) && (node_00->schema != (lysc_node *)0x0)) &&
                 ((node_00->schema->nodetype & 0x60) == 0)) &&
                (plVar6 = lysc_data_node(node->schema->parent), plVar6 != node_00->schema)) {
          if (node->schema == (lysc_node *)0x0) {
            plVar6 = (lysc_node *)0x0;
          }
          else {
            plVar6 = node->schema->parent;
          }
          plVar6 = lysc_data_node(plVar6);
          if (plVar6 == (lysc_node *)0x0) {
            if (node->schema == (lysc_node *)0x0) {
              plVar11 = (lys_module *)&node[2].schema;
            }
            else {
              plVar11 = node->schema->module;
            }
            plVar6 = node_00->schema;
            if (plVar6 == (lysc_node *)0x0) {
              plVar7 = (lys_module *)&node_00[2].schema;
            }
            else {
              plVar7 = plVar6->module;
            }
            if (plVar11->ctx != plVar7->ctx) goto LAB_0012339b;
          }
          else {
            plVar6 = node_00->schema;
          }
          if ((plVar6->nodetype & 0x700) == 0) {
            __assert_fail("!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) || (lysc_data_parent(iter->schema) == parent->schema) || (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) || (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                          ,0xb74,"char *lyd_path_set(const struct ly_set *, LYD_PATH_TYPE)");
          }
        }
LAB_0012339b:
        plVar7 = lyd_node_module(node_00);
        plVar11 = (lys_module *)0x0;
        if (plVar7 != plVar5) {
          plVar11 = plVar5;
        }
        if (plVar11 == (lys_module *)0x0) {
          lVar13 = 2;
        }
        else {
          sVar8 = strlen(plVar11->name);
          lVar13 = sVar8 + 3;
        }
        pplVar9 = (lysc_node **)&node->schema->name;
        if (node->schema == (lysc_node *)0x0) {
          pplVar9 = &node[1].schema;
        }
        sVar8 = strlen((char *)*pplVar9);
        sVar1 = local_48;
        size = lVar13 + local_48 + sVar8;
        if ((local_50 < size) &&
           (local_58 = (char *)ly_realloc(local_58,size), local_50 = size, local_58 == (char *)0x0))
        {
          return (char *)0x0;
        }
        pcVar12 = "";
        pcVar10 = "";
        if (plVar11 != (lys_module *)0x0) {
          pcVar12 = plVar11->name;
          pcVar10 = ":";
        }
        bVar15 = local_3c == LYD_PATH_STD;
        iVar3 = sprintf(local_58 + sVar1,"/%s%s%s",pcVar12,pcVar10);
        local_48 = (long)iVar3 + sVar1;
        if ((bVar15 || 1 < uVar14) && (plVar6 = node->schema, plVar6 != (lysc_node *)0x0)) {
          if (plVar6->nodetype == 8) {
            if ((plVar6->flags & 1) == 0) {
LAB_001234ba:
              LVar4 = lyd_path_position_predicate(node,&local_58,&local_50,&local_48,'\0');
            }
            else {
              LVar4 = lyd_path_leaflist_predicate(node,&local_58,&local_50,&local_48,'\0');
            }
          }
          else {
            if (plVar6->nodetype != 0x10) goto LAB_001234f0;
            if ((plVar6->flags & 0x200) != 0) goto LAB_001234ba;
            LVar4 = lyd_path_list_predicate(node,&local_58,&local_50,&local_48,'\0');
          }
          if (LVar4 != LY_SUCCESS) {
            return local_58;
          }
        }
LAB_001234f0:
        uVar14 = uVar14 + 1;
        pcVar12 = local_58;
      } while (uVar14 <= local_38->count);
    }
  }
  return pcVar12;
}

Assistant:

char *
lyd_path_set(const struct ly_set *dnodes, LYD_PATH_TYPE pathtype)
{
    uint32_t depth;
    size_t bufused = 0, buflen = 0, len;
    char *buffer = NULL;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        for (depth = 1; depth <= dnodes->count; ++depth) {
            /* current node */
            iter = dnodes->dnodes[depth - 1];
            mod = lyd_node_module(iter);

            /* parent */
            parent = (depth > 1) ? dnodes->dnodes[depth - 2] : NULL;
            assert(!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) ||
                    (lysc_data_parent(iter->schema) == parent->schema) ||
                    (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) ||
                    (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)));

            /* get module to print, if any */
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            if ((rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, 0))) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc) {
                break;
            }
        }
        break;
    }

    return buffer;
}